

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  int iVar1;
  long lVar2;
  pointer pCVar3;
  pointer pcVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  string *psVar8;
  bool bVar9;
  string added_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  long *local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->HG,&this->Rev,&this->Changes);
  }
  else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar1 == 0) {
      psVar8 = &(this->Rev).Author;
      pcVar6 = (char *)(this->Rev).Author._M_string_length;
    }
    else {
      if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_00310fa4;
      iVar1 = std::__cxx11::string::compare((char *)name);
      pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        psVar8 = &(this->Rev).EMail;
        pcVar6 = (char *)(this->Rev).EMail._M_string_length;
      }
      else {
        if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_00310fa4;
        iVar1 = std::__cxx11::string::compare((char *)name);
        pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar1 == 0) {
          psVar8 = &(this->Rev).Date;
          pcVar6 = (char *)(this->Rev).Date._M_string_length;
        }
        else {
          if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_00310fa4;
          iVar1 = std::__cxx11::string::compare((char *)name);
          pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (iVar1 != 0) {
            if (pcVar4 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                SplitCData_abi_cxx11_(&local_48,this);
                if (local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  psVar8 = &(this->CurChange).Path;
                  local_50 = &this->Changes;
                  uVar5 = 1;
                  do {
                    local_78 = (long *)CONCAT71(local_78._1_7_,0x55);
                    local_68 = 0;
                    local_60 = 0;
                    (this->CurChange).Action = 'U';
                    local_70 = &local_60;
                    std::__cxx11::string::operator=((string *)psVar8,(string *)&local_70);
                    if (local_70 != &local_60) {
                      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
                    }
                    std::__cxx11::string::_M_assign((string *)psVar8);
                    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                    push_back(local_50,&this->CurChange);
                    bVar9 = uVar5 < (ulong)((long)local_48.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_48.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5);
                    uVar5 = (ulong)((int)uVar5 + 1);
                  } while (bVar9);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_48);
              }
              else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish) {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  local_78 = &local_68;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)&local_78);
                  pCVar3 = (this->Changes).
                           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((this->Changes).
                      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
                    uVar5 = 0;
                    uVar7 = 1;
                    do {
                      lVar2 = std::__cxx11::string::find
                                        ((char *)&local_78,
                                         (ulong)pCVar3[uVar5].Path._M_dataplus._M_p,0);
                      pCVar3 = (this->Changes).
                               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if (lVar2 != -1) {
                        pCVar3[uVar5].Action = 'A';
                      }
                      uVar5 = ((long)(this->Changes).
                                     super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                              * -0x3333333333333333;
                      bVar9 = uVar7 <= uVar5;
                      lVar2 = uVar5 - uVar7;
                      uVar5 = uVar7;
                      uVar7 = (ulong)((int)uVar7 + 1);
                    } while (bVar9 && lVar2 != 0);
                  }
                }
                else {
                  if (((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start ==
                       (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish) ||
                     (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0))
                  goto LAB_00310fa4;
                  local_78 = &local_68;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)&local_78,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish);
                  pCVar3 = (this->Changes).
                           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((this->Changes).
                      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
                    uVar5 = 0;
                    uVar7 = 1;
                    do {
                      lVar2 = std::__cxx11::string::find
                                        ((char *)&local_78,
                                         (ulong)pCVar3[uVar5].Path._M_dataplus._M_p,0);
                      pCVar3 = (this->Changes).
                               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if (lVar2 != -1) {
                        pCVar3[uVar5].Action = 'D';
                      }
                      uVar5 = ((long)(this->Changes).
                                     super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                              * -0x3333333333333333;
                      bVar9 = uVar7 <= uVar5;
                      lVar2 = uVar5 - uVar7;
                      uVar5 = uVar7;
                      uVar7 = (ulong)((int)uVar7 + 1);
                    } while (bVar9 && lVar2 != 0);
                  }
                }
                if (local_78 != &local_68) {
                  operator_delete(local_78,local_68 + 1);
                }
              }
            }
            goto LAB_00310fa4;
          }
          psVar8 = &(this->Rev).Log;
          pcVar6 = (char *)(this->Rev).Log._M_string_length;
        }
      }
    }
    std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar6,(ulong)pcVar4);
  }
LAB_00310fa4:
  pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar4) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar4;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) CM_OVERRIDE
  {
    if (name == "logentry") {
      this->HG->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "email") {
      this->Rev.EMail.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "files") {
      std::vector<std::string> paths = this->SplitCData();
      for (unsigned int i = 0; i < paths.size(); ++i) {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = paths[i];
        this->Changes.push_back(this->CurChange);
      }
    } else if (!this->CData.empty() && name == "file_adds") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (unsigned int i = 0; i < this->Changes.size(); ++i) {
        if (added_paths.find(this->Changes[i].Path) != std::string::npos) {
          this->Changes[i].Action = 'A';
        }
      }
    } else if (!this->CData.empty() && name == "file_dels") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (unsigned int i = 0; i < this->Changes.size(); ++i) {
        if (added_paths.find(this->Changes[i].Path) != std::string::npos) {
          this->Changes[i].Action = 'D';
        }
      }
    }
    this->CData.clear();
  }